

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O2

SourceLocation __thiscall
slang::getMatchingMacroLoc
          (slang *this,SourceManager *sm,SourceLocation loc,SourceLocation contextLoc,bool isStart,
          span<const_slang::BufferID,_18446744073709551615UL> commonArgs)

{
  bool bVar1;
  SourceLocation SVar2;
  __extent_storage<18446744073709551615UL> _Var3;
  SourceLocation SVar4;
  uint uVar5;
  undefined7 in_register_00000081;
  undefined8 uVar6;
  undefined1 isStart_00;
  SourceRange SVar7;
  span<const_slang::BufferID,_18446744073709551615UL> commonArgs_00;
  undefined1 in_stack_ffffffffffffffa8 [16];
  span<const_slang::BufferID,_18446744073709551615UL> sVar8;
  span<const_slang::BufferID,_18446744073709551615UL> commonArgs_01;
  undefined8 local_48 [2];
  uint local_34;
  
  uVar6 = CONCAT71(in_register_00000081,isStart);
  uVar5 = (uint)sm & 0xfffffff;
  if (uVar5 != (loc._0_4_ & 0xfffffff)) {
    sVar8._M_extent._M_extent_value._4_4_ = in_stack_ffffffffffffffa8._12_4_;
    sVar8._M_ptr = in_stack_ffffffffffffffa8._0_8_;
    sVar8._M_extent._M_extent_value._0_4_ = contextLoc._0_4_;
    local_48[0] = uVar6;
    bVar1 = SourceManager::isMacroLoc((SourceManager *)this,(SourceLocation)sm);
    if (bVar1) {
      bVar1 = SourceManager::isMacroArgLoc((SourceManager *)this,(SourceLocation)sm);
      _Var3 = sVar8._M_extent._M_extent_value;
      if (bVar1) {
        local_34 = uVar5;
        bVar1 = std::ranges::__binary_search_fn::
                operator()<std::span<const_slang::BufferID,_18446744073709551615UL>_&,_slang::BufferID,_std::identity,_std::ranges::less>
                          ((__binary_search_fn *)&std::ranges::binary_search,local_48);
        if (bVar1) {
          SVar2 = SourceManager::getOriginalLoc((SourceManager *)this,(SourceLocation)sm);
        }
        else {
          SVar2 = (SourceLocation)0x0;
        }
        commonArgs_00 =
             (span<const_slang::BufferID,_18446744073709551615UL>)
             SourceManager::getExpansionRange((SourceManager *)this,(SourceLocation)sm);
        SVar4 = SVar2;
        uVar6 = local_48[0];
      }
      else {
        SVar7 = SourceManager::getExpansionRange((SourceManager *)this,(SourceLocation)sm);
        SVar4 = SVar7.endLoc;
        sVar8._M_extent._M_extent_value = _Var3._M_extent_value;
        sVar8._M_ptr = (pointer)SVar7.startLoc;
        _Var3._M_extent_value =
             (size_t)SourceManager::getOriginalLoc((SourceManager *)this,(SourceLocation)sm);
        SVar2 = (SourceLocation)sVar8._M_ptr;
        commonArgs_00._M_extent._M_extent_value = _Var3._M_extent_value;
        commonArgs_00._M_ptr = (pointer)_Var3._M_extent_value;
      }
      isStart_00 = (undefined1)uVar6;
      if ((char)sVar8._M_extent._M_extent_value != '\0') {
        SVar4 = SVar2;
      }
      SVar2._0_4_ = (uint)sVar8._M_extent._M_extent_value & 0xff;
      SVar2._4_4_ = 0;
      commonArgs_01 = sVar8;
      if (((ulong)SVar4 & 0xfffffff) != 0) {
        SVar4 = getMatchingMacroLoc(this,(SourceManager *)SVar4,loc,SVar2,(bool)isStart_00,
                                    commonArgs_00);
        if (((ulong)SVar4 & 0xfffffff) != 0) {
          return SVar4;
        }
        isStart_00 = (undefined1)local_48[0];
        commonArgs_01 = commonArgs_00;
      }
      SVar4._4_4_ = 0;
      SVar4._0_4_ = SVar2._0_4_;
      _Var3._M_extent_value = commonArgs_00._M_extent._M_extent_value._M_extent_value;
      if ((char)sVar8._M_extent._M_extent_value != '\0') {
        _Var3._M_extent_value = (size_t)commonArgs_00._M_ptr;
      }
      sm = (SourceManager *)
           getMatchingMacroLoc(this,(SourceManager *)_Var3._M_extent_value,loc,SVar4,
                               (bool)isStart_00,commonArgs_01);
    }
    else {
      sm = (SourceManager *)0x0;
    }
  }
  return (SourceLocation)sm;
}

Assistant:

static SourceLocation getMatchingMacroLoc(const SourceManager& sm, SourceLocation loc,
                                          SourceLocation contextLoc, bool isStart,
                                          std::span<const BufferID> commonArgs) {
    if (loc.buffer() == contextLoc.buffer())
        return loc;

    if (!sm.isMacroLoc(loc))
        return {};

    SourceRange macroRange;
    SourceRange macroArgRange;
    if (sm.isMacroArgLoc(loc)) {
        // Only look at the original location of this argument if the other location
        // in the range is also present in the expansion.
        if (std::ranges::binary_search(commonArgs, loc.buffer())) {
            SourceLocation orig = sm.getOriginalLoc(loc);
            macroRange = SourceRange(orig, orig);
        }
        macroArgRange = sm.getExpansionRange(loc);
    }
    else {
        macroRange = sm.getExpansionRange(loc);

        SourceLocation orig = sm.getOriginalLoc(loc);
        macroArgRange = SourceRange(orig, orig);
    }

    SourceLocation macroLoc = isStart ? macroRange.start() : macroRange.end();
    if (macroLoc) {
        macroLoc = getMatchingMacroLoc(sm, macroLoc, contextLoc, isStart, commonArgs);
        if (macroLoc)
            return macroLoc;
    }

    SourceLocation argLoc = isStart ? macroArgRange.start() : macroArgRange.end();
    return getMatchingMacroLoc(sm, argLoc, contextLoc, isStart, commonArgs);
}